

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXConverter.cpp
# Opt level: O2

void __thiscall
Assimp::FBX::FBXConverter::ConvertNodes
          (FBXConverter *this,uint64_t id,aiNode *parent,aiMatrix4x4 *parent_transform)

{
  aiNode *paVar1;
  pointer ppaVar2;
  bool bVar3;
  Object *pOVar4;
  Model *model;
  aiNode *paVar5;
  aiNode **ppaVar6;
  ImportSettings *pIVar7;
  pointer ppaVar8;
  ulong uVar9;
  FBXConverter *this_00;
  pointer ppaVar10;
  ulong __n;
  vector<aiNode_*,_std::allocator<aiNode_*>_> nodes_chain;
  vector<aiNode_*,_std::allocator<aiNode_*>_> post_nodes_chain;
  vector<aiNode_*,_std::allocator<aiNode_*>_> nodes;
  _Vector_base<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
  local_e0;
  aiMatrix4x4 *local_c8;
  pointer local_c0;
  pointer local_b8;
  _Vector_base<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
  local_b0;
  aiMatrix4x4 new_abs_transform;
  string unique_name;
  
  local_c8 = parent_transform;
  Document::GetConnectionsByDestinationSequenced
            ((vector<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
              *)&local_b0,this->doc,id,"Model");
  nodes.super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  nodes.super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  nodes.super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::vector<aiNode_*,_std::allocator<aiNode_*>_>::reserve
            (&nodes,(long)local_b0._M_impl.super__Vector_impl_data._M_finish -
                    (long)local_b0._M_impl.super__Vector_impl_data._M_start >> 3);
  nodes_chain.super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  nodes_chain.super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  nodes_chain.super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  post_nodes_chain.super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  post_nodes_chain.super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  post_nodes_chain.super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_b8 = (pointer)local_b0._M_impl.super__Vector_impl_data._M_finish;
  ppaVar10 = (pointer)local_b0._M_impl.super__Vector_impl_data._M_start;
  do {
    ppaVar8 = nodes.super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    ppaVar2 = nodes.super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    if (ppaVar10 == local_b8) {
      if ((long)nodes.super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)nodes.super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
                super__Vector_impl_data._M_start != 0) {
        uVar9 = (long)nodes.super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)nodes.super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
                      super__Vector_impl_data._M_start >> 3;
        __n = -(ulong)(uVar9 >> 0x3d != 0) |
              (long)nodes.super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)nodes.super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
                    super__Vector_impl_data._M_start;
        ppaVar6 = (aiNode **)operator_new__(__n);
        memset(ppaVar6,0,__n);
        parent->mChildren = ppaVar6;
        parent->mNumChildren = (uint)uVar9;
        std::
        swap_ranges<__gnu_cxx::__normal_iterator<aiNode**,std::vector<aiNode*,std::allocator<aiNode*>>>,aiNode**>
                  ((__normal_iterator<aiNode_**,_std::vector<aiNode_*,_std::allocator<aiNode_*>_>_>)
                   ppaVar2,(__normal_iterator<aiNode_**,_std::vector<aiNode_*,_std::allocator<aiNode_*>_>_>
                            )ppaVar8,ppaVar6);
      }
      std::_Vector_base<aiNode_*,_std::allocator<aiNode_*>_>::~_Vector_base
                (&post_nodes_chain.super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>);
      std::_Vector_base<aiNode_*,_std::allocator<aiNode_*>_>::~_Vector_base
                (&nodes_chain.super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>);
      std::_Vector_base<aiNode_*,_std::allocator<aiNode_*>_>::~_Vector_base
                (&nodes.super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>);
      std::
      _Vector_base<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
      ::~_Vector_base(&local_b0);
      return;
    }
    if (*(size_type *)(((*ppaVar10)->mName).data + 0xc) == 0) {
      pOVar4 = Connection::SourceObject((Connection *)*ppaVar10);
      if (pOVar4 == (Object *)0x0) {
        LogFunctions<Assimp::FBXImporter>::LogWarn((char *)0x159a3a);
      }
      else {
        model = (Model *)__dynamic_cast(pOVar4,&Object::typeinfo,&Model::typeinfo,0);
        if (model != (Model *)0x0) {
          if (nodes_chain.super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
              super__Vector_impl_data._M_finish !=
              nodes_chain.super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
              super__Vector_impl_data._M_start) {
            nodes_chain.super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 nodes_chain.super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
          }
          if (post_nodes_chain.super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
              super__Vector_impl_data._M_finish !=
              post_nodes_chain.super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
              super__Vector_impl_data._M_start) {
            post_nodes_chain.super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 post_nodes_chain.super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
          }
          new_abs_transform.a1 = local_c8->a1;
          new_abs_transform.a2 = local_c8->a2;
          new_abs_transform.a3 = local_c8->a3;
          new_abs_transform.a4 = local_c8->a4;
          new_abs_transform.b1 = local_c8->b1;
          new_abs_transform.b2 = local_c8->b2;
          new_abs_transform.b3 = local_c8->b3;
          new_abs_transform.b4 = local_c8->b4;
          new_abs_transform.c1 = local_c8->c1;
          new_abs_transform.c2 = local_c8->c2;
          new_abs_transform.c3 = local_c8->c3;
          new_abs_transform.c4 = local_c8->c4;
          new_abs_transform.d1 = local_c8->d1;
          new_abs_transform.d2 = local_c8->d2;
          new_abs_transform.d3 = local_c8->d3;
          new_abs_transform.d4 = local_c8->d4;
          MakeUniqueNodeName_abi_cxx11_(&unique_name,this,model,parent);
          this_00 = this;
          bVar3 = GenerateTransformationNodeChain
                            (this,model,&unique_name,&nodes_chain,&post_nodes_chain);
          if (nodes_chain.super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              nodes_chain.super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
              super__Vector_impl_data._M_start) {
            __assert_fail("nodes_chain.size()",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/royalneverwin[P]Computer_graphics/third_party/assimp/code/FBX/FBXConverter.cpp"
                          ,0xde,
                          "void Assimp::FBX::FBXConverter::ConvertNodes(uint64_t, aiNode &, const aiMatrix4x4 &)"
                         );
          }
          if (bVar3) {
            paVar5 = (aiNode *)operator_new(0x478);
            aiNode::aiNode(paVar5,&unique_name);
            this_00 = (FBXConverter *)&nodes_chain;
            local_e0._M_impl.super__Vector_impl_data._M_start = (pointer)paVar5;
            std::vector<aiNode*,std::allocator<aiNode*>>::emplace_back<aiNode*>
                      ((vector<aiNode*,std::allocator<aiNode*>> *)this_00,(aiNode **)&local_e0);
          }
          SetupNodeMetadata(this_00,model,
                            nodes_chain.super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>.
                            _M_impl.super__Vector_impl_data._M_finish[-1]);
          ppaVar2 = nodes_chain.super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
                    super__Vector_impl_data._M_finish;
          paVar5 = parent;
          local_c0 = ppaVar10;
          for (ppaVar8 = nodes_chain.super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl
                         .super__Vector_impl_data._M_start; ppaVar8 != ppaVar2;
              ppaVar8 = ppaVar8 + 1) {
            paVar1 = *ppaVar8;
            if (paVar1 == (aiNode *)0x0) {
              __assert_fail("prenode",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/royalneverwin[P]Computer_graphics/third_party/assimp/code/FBX/FBXConverter.cpp"
                            ,0xea,
                            "void Assimp::FBX::FBXConverter::ConvertNodes(uint64_t, aiNode &, const aiMatrix4x4 &)"
                           );
            }
            if (paVar5 != parent) {
              paVar5->mNumChildren = 1;
              ppaVar6 = (aiNode **)operator_new__(8);
              paVar5->mChildren = ppaVar6;
              *ppaVar6 = paVar1;
            }
            paVar1->mParent = paVar5;
            aiMatrix4x4t<float>::operator*=(&new_abs_transform,&paVar1->mTransformation);
            paVar5 = paVar1;
          }
          ConvertModel(this,model,
                       nodes_chain.super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
                       super__Vector_impl_data._M_finish[-1],&new_abs_transform);
          Document::GetConnectionsByDestinationSequenced
                    ((vector<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
                      *)&local_e0,this->doc,(model->super_Object).id,"Model");
          ppaVar2 = post_nodes_chain.super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl
                    .super__Vector_impl_data._M_finish;
          ppaVar8 = post_nodes_chain.super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl
                    .super__Vector_impl_data._M_start;
          if (local_e0._M_impl.super__Vector_impl_data._M_finish ==
              local_e0._M_impl.super__Vector_impl_data._M_start) {
            std::
            for_each<__gnu_cxx::__normal_iterator<aiNode**,std::vector<aiNode*,std::allocator<aiNode*>>>,Assimp::FBX::Util::delete_fun<aiNode>>
                      (post_nodes_chain.super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>.
                       _M_impl.super__Vector_impl_data._M_start,
                       post_nodes_chain.super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>.
                       _M_impl.super__Vector_impl_data._M_finish);
          }
          else {
            for (; ppaVar8 != ppaVar2; ppaVar8 = ppaVar8 + 1) {
              paVar1 = *ppaVar8;
              if (paVar1 == (aiNode *)0x0) {
                __assert_fail("postnode",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/royalneverwin[P]Computer_graphics/third_party/assimp/code/FBX/FBXConverter.cpp"
                              ,0x103,
                              "void Assimp::FBX::FBXConverter::ConvertNodes(uint64_t, aiNode &, const aiMatrix4x4 &)"
                             );
              }
              if (paVar5 != parent) {
                paVar5->mNumChildren = 1;
                ppaVar6 = (aiNode **)operator_new__(8);
                paVar5->mChildren = ppaVar6;
                *ppaVar6 = paVar1;
              }
              paVar1->mParent = paVar5;
              aiMatrix4x4t<float>::operator*=(&new_abs_transform,&paVar1->mTransformation);
              paVar5 = paVar1;
            }
          }
          ConvertNodes(this,(model->super_Object).id,paVar5,&new_abs_transform);
          ppaVar10 = local_c0;
          pIVar7 = this->doc->settings;
          if (pIVar7->readLights == true) {
            ConvertLights(this,model,&unique_name);
            pIVar7 = this->doc->settings;
          }
          if (pIVar7->readCameras == true) {
            ConvertCameras(this,model,&unique_name);
          }
          std::vector<aiNode_*,_std::allocator<aiNode_*>_>::push_back
                    (&nodes,nodes_chain.super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>.
                            _M_impl.super__Vector_impl_data._M_start);
          if (nodes_chain.super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
              super__Vector_impl_data._M_finish !=
              nodes_chain.super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
              super__Vector_impl_data._M_start) {
            nodes_chain.super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 nodes_chain.super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
          }
          std::
          _Vector_base<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
          ::~_Vector_base(&local_e0);
          std::__cxx11::string::~string((string *)&unique_name);
        }
      }
    }
    ppaVar10 = ppaVar10 + 1;
  } while( true );
}

Assistant:

void FBXConverter::ConvertNodes(uint64_t id, aiNode& parent, const aiMatrix4x4& parent_transform) {
            const std::vector<const Connection*>& conns = doc.GetConnectionsByDestinationSequenced(id, "Model");

            std::vector<aiNode*> nodes;
            nodes.reserve(conns.size());

            std::vector<aiNode*> nodes_chain;
            std::vector<aiNode*> post_nodes_chain;

            try {
                for (const Connection* con : conns) {

                    // ignore object-property links
                    if (con->PropertyName().length()) {
                        continue;
                    }

                    const Object* const object = con->SourceObject();
                    if (nullptr == object) {
                        FBXImporter::LogWarn("failed to convert source object for Model link");
                        continue;
                    }

                    const Model* const model = dynamic_cast<const Model*>(object);

                    if (nullptr != model) {
                        nodes_chain.clear();
                        post_nodes_chain.clear();

                        aiMatrix4x4 new_abs_transform = parent_transform;

                        std::string unique_name = MakeUniqueNodeName(model, parent);

                        // even though there is only a single input node, the design of
                        // assimp (or rather: the complicated transformation chain that
                        // is employed by fbx) means that we may need multiple aiNode's
                        // to represent a fbx node's transformation.
                        const bool need_additional_node = GenerateTransformationNodeChain(*model, unique_name, nodes_chain, post_nodes_chain);

                        ai_assert(nodes_chain.size());

                        if (need_additional_node) {
                            nodes_chain.push_back(new aiNode(unique_name));
                        }

                        //setup metadata on newest node
                        SetupNodeMetadata(*model, *nodes_chain.back());

                        // link all nodes in a row
                        aiNode* last_parent = &parent;
                        for (aiNode* prenode : nodes_chain) {
                            ai_assert(prenode);

                            if (last_parent != &parent) {
                                last_parent->mNumChildren = 1;
                                last_parent->mChildren = new aiNode*[1];
                                last_parent->mChildren[0] = prenode;
                            }

                            prenode->mParent = last_parent;
                            last_parent = prenode;

                            new_abs_transform *= prenode->mTransformation;
                        }

                        // attach geometry
                        ConvertModel(*model, *nodes_chain.back(), new_abs_transform);

                        // check if there will be any child nodes
                        const std::vector<const Connection*>& child_conns
                            = doc.GetConnectionsByDestinationSequenced(model->ID(), "Model");

                        // if so, link the geometric transform inverse nodes
                        // before we attach any child nodes
                        if (child_conns.size()) {
                            for (aiNode* postnode : post_nodes_chain) {
                                ai_assert(postnode);

                                if (last_parent != &parent) {
                                    last_parent->mNumChildren = 1;
                                    last_parent->mChildren = new aiNode*[1];
                                    last_parent->mChildren[0] = postnode;
                                }

                                postnode->mParent = last_parent;
                                last_parent = postnode;

                                new_abs_transform *= postnode->mTransformation;
                            }
                        }
                        else {
                            // free the nodes we allocated as we don't need them
                            Util::delete_fun<aiNode> deleter;
                            std::for_each(
                                post_nodes_chain.begin(),
                                post_nodes_chain.end(),
                                deleter
                            );
                        }

                        // attach sub-nodes (if any)
                        ConvertNodes(model->ID(), *last_parent, new_abs_transform);

                        if (doc.Settings().readLights) {
                            ConvertLights(*model, unique_name);
                        }

                        if (doc.Settings().readCameras) {
                            ConvertCameras(*model, unique_name);
                        }

                        nodes.push_back(nodes_chain.front());
                        nodes_chain.clear();
                    }
                }

                if (nodes.size()) {
                    parent.mChildren = new aiNode*[nodes.size()]();
                    parent.mNumChildren = static_cast<unsigned int>(nodes.size());

                    std::swap_ranges(nodes.begin(), nodes.end(), parent.mChildren);
                }
            }
            catch (std::exception&) {
                Util::delete_fun<aiNode> deleter;
                std::for_each(nodes.begin(), nodes.end(), deleter);
                std::for_each(nodes_chain.begin(), nodes_chain.end(), deleter);
                std::for_each(post_nodes_chain.begin(), post_nodes_chain.end(), deleter);
            }
        }